

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlSchema.cpp
# Opt level: O1

void __thiscall opencollada::XmlSchema::~XmlSchema(XmlSchema *this)

{
  pointer pcVar1;
  
  if (this->mSchema != (xmlSchemaPtr)0x0) {
    xmlSchemaFree();
    this->mSchema = (xmlSchemaPtr)0x0;
  }
  pcVar1 = (this->mUri).mFragment._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mUri).mFragment.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->mUri).mQuery._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mUri).mQuery.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->mUri).mPath._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mUri).mPath.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->mUri).mAuthority._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mUri).mAuthority.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->mUri).mScheme._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mUri).mScheme.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->mUri).mUri._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mUri).mUri.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

XmlSchema::~XmlSchema()
	{
		if (mSchema)
		{
			xmlSchemaFree(mSchema);
			mSchema = nullptr;
		}
	}